

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall
Json::Reader::parse(Reader *this,char *beginDoc,char *endDoc,Value *root,bool collectComments)

{
  bool bVar1;
  bool bVar2;
  allocator local_89;
  Token token;
  String local_70;
  String local_50;
  
  bVar1 = (this->features_).allowComments_;
  this->begin_ = beginDoc;
  this->end_ = endDoc;
  this->collectComments_ = (bool)(collectComments & bVar1);
  this->current_ = beginDoc;
  (this->commentsBefore_)._M_string_length = 0;
  this->lastValueEnd_ = (Location)0x0;
  this->lastValue_ = (Value *)0x0;
  *(this->commentsBefore_)._M_dataplus._M_p = '\0';
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::clear
            (&this->errors_);
  while ((this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur !=
         (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur) {
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
  }
  local_70._M_dataplus._M_p = (pointer)root;
  std::deque<Json::Value*,std::allocator<Json::Value*>>::emplace_back<Json::Value*>
            ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)&local_70);
  bVar1 = readValue(this);
  readTokenSkippingComments(this,&token);
  if ((this->collectComments_ == true) && ((this->commentsBefore_)._M_string_length != 0)) {
    std::__cxx11::string::string((string *)&local_50,(string *)&this->commentsBefore_);
    Value::setComment(root,&local_50,commentAfter);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((this->features_).strictRoot_ == true) {
    bVar2 = Value::isArray(root);
    if (!bVar2) {
      bVar2 = Value::isObject(root);
      if (!bVar2) {
        token.type_ = tokenError;
        token.start_ = beginDoc;
        token.end_ = endDoc;
        std::__cxx11::string::string
                  ((string *)&local_70,
                   "A valid JSON document must be either an array or an object value.",&local_89);
        addError(this,&local_70,&token,(Location)0x0);
        std::__cxx11::string::~string((string *)&local_70);
        bVar1 = false;
      }
    }
  }
  return bVar1;
}

Assistant:

bool Reader::parse(const char* beginDoc, const char* endDoc, Value& root,
                   bool collectComments) {
  if (!features_.allowComments_) {
    collectComments = false;
  }

  begin_ = beginDoc;
  end_ = endDoc;
  collectComments_ = collectComments;
  current_ = begin_;
  lastValueEnd_ = nullptr;
  lastValue_ = nullptr;
  commentsBefore_.clear();
  errors_.clear();
  while (!nodes_.empty())
    nodes_.pop();
  nodes_.push(&root);

  bool successful = readValue();
  Token token;
  readTokenSkippingComments(token);
  if (collectComments_ && !commentsBefore_.empty())
    root.setComment(commentsBefore_, commentAfter);
  if (features_.strictRoot_) {
    if (!root.isArray() && !root.isObject()) {
      // Set error location to start of doc, ideally should be first token found
      // in doc
      token.type_ = tokenError;
      token.start_ = beginDoc;
      token.end_ = endDoc;
      addError(
          "A valid JSON document must be either an array or an object value.",
          token);
      return false;
    }
  }
  return successful;
}